

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::getDifferentiationWeights
          (GridLocalPolynomial *this,double *x,double *weights)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  vector<int,_std::allocator<int>_> *__range1;
  long lVar5;
  ulong uVar6;
  MultiIndexSet *work;
  vector<int,_std::allocator<int>_> active_points;
  vector<double,_std::allocator<double>_> diff_hbasis_values;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  undefined8 local_30;
  
  work = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    work = &(this->super_BaseCanonicalGrid).needed;
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = 0;
  ::std::__fill_n_a<double*,int,double>(weights,work->cache_num_indexes);
  uVar6 = 0;
  walkTree<4>(this,work,x,(vector<int,_std::allocator<int>_> *)&local_68,
              (vector<double,_std::allocator<double>_> *)&local_48,(double *)0x0);
  uVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  pdVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
  for (piVar4 = local_68._M_impl.super__Vector_impl_data._M_start;
      piVar4 != local_68._M_impl.super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
    iVar2 = *piVar4;
    for (lVar5 = 0; uVar6 * 8 != lVar5; lVar5 = lVar5 + 8) {
      *(undefined8 *)((long)weights + lVar5 + (long)(int)(iVar2 * uVar1) * 8) =
           *(undefined8 *)((long)pdVar3 + lVar5);
    }
    pdVar3 = (pointer)((long)pdVar3 + lVar5);
  }
  applyTransformationTransposed<1>(this,weights,work,(vector<int,_std::allocator<int>_> *)&local_68)
  ;
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void GridLocalPolynomial::getDifferentiationWeights(const double x[], double weights[]) const {
    // Based on GridLocalPolynomial::getInterpolationWeights().
    const MultiIndexSet &work = (points.empty()) ? needed : points;

    std::vector<int> active_points;
    std::vector<double> diff_hbasis_values;
    std::fill_n(weights, work.getNumIndexes(), 0.0);

    walkTree<4>(work, x, active_points, diff_hbasis_values, nullptr);
    auto ibasis = diff_hbasis_values.begin();
    for(auto i : active_points)
        for (int d=0; d<num_dimensions; d++)
            weights[i * num_dimensions + d] = *ibasis++;
    applyTransformationTransposed<1>(weights, work, active_points);
}